

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtooltip.cpp
# Opt level: O0

void __thiscall QTipLabel::placeTip(QTipLabel *this,QPoint *pos,QWidget *w)

{
  QLatin1StringView latin1;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QStyleSheetStyle *pQVar6;
  QScreen *pQVar7;
  long *plVar8;
  int *piVar9;
  QWidget *in_RDX;
  long in_FS_OFFSET;
  QPlatformCursor *cursor;
  QPlatformScreen *platformScreen;
  QScreen *screen;
  QRect screenRect;
  QPoint offset;
  QSize cursorSize;
  QSize nativeSize;
  QPoint p;
  int in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  WidgetAttribute in_stack_fffffffffffffea4;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  int in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  int in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  long *local_100;
  QTipLabel *signal;
  ConnectionType in_stack_ffffffffffffff30;
  Connection local_50 [4];
  QWidget *local_30;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = in_RDX;
  bVar1 = QWidget::testAttribute
                    ((QWidget *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                     in_stack_fffffffffffffea4);
  if (!bVar1) {
    if (local_30 == (QWidget *)0x0) goto LAB_004c0fa6;
    QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    pQVar6 = qt_styleSheet((QStyle *)0x4c0e36);
    if (pQVar6 == (QStyleSheetStyle *)0x0) goto LAB_004c0fa6;
  }
  ::QVariant::fromValue<QWidget*>
            ((QWidget **)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  QObject::setProperty
            ((QObject *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
             (QVariant *)0x4c0e7a);
  ::QVariant::~QVariant(&local_28);
  signal = instance;
  Qt::Literals::StringLiterals::operator____L1
            ((char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  latin1.m_size._4_4_ = in_stack_fffffffffffffed4;
  latin1.m_size._0_4_ = in_stack_fffffffffffffed0;
  latin1.m_data._0_4_ = in_stack_fffffffffffffed8;
  latin1.m_data._4_4_ = in_stack_fffffffffffffedc;
  QString::QString((QString *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),latin1);
  QWidget::setStyleSheet
            ((QWidget *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             (QString *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  QString::~QString((QString *)0x4c0ef0);
  instance->styleSheetParent = local_30;
  if (local_30 != (QWidget *)0x0) {
    in_stack_fffffffffffffe98 = 0;
    QObject::connect<void(QObject::*)(QObject*),void(QTipLabel::*)()>
              ((Object *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (offset_in_QObject_to_subr)signal,
               (ContextType *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               (offset_in_QTipLabel_to_subr *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               in_stack_ffffffffffffff30);
    QMetaObject::Connection::~Connection(local_50);
  }
  updateSize((QTipLabel *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
             (QPoint *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
LAB_004c0fa6:
  pQVar7 = getTipScreen((QPoint *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                        (QWidget *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  if (pQVar7 == (QScreen *)0x0) {
    local_100 = (long *)0x0;
  }
  else {
    local_100 = (long *)QScreen::handle();
  }
  if (local_100 != (long *)0x0) {
    plVar8 = (long *)(**(code **)(*local_100 + 0xb0))();
    if (plVar8 == (long *)0x0) {
      QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                   in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98);
    }
    else {
      (**(code **)(*plVar8 + 0x90))();
    }
    QHighDpi::fromNativePixels<QSize,QPlatformScreen>
              ((QSize *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               (QPlatformScreen *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    QSize::height((QSize *)0x4c10d3);
    QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                   in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98);
    iVar2 = QSize::height((QSize *)0x4c10f4);
    iVar3 = QWidget::height((QWidget *)0x4c1105);
    if (iVar2 != iVar3 * 2 && SBORROW4(iVar2,iVar3 * 2) == iVar2 + iVar3 * -2 < 0) {
      QSize::width((QSize *)0x4c111e);
      QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                     in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98);
    }
    QPoint::operator+=((QPoint *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                       (QPoint *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    QScreen::geometry();
    iVar2 = QPoint::x((QPoint *)0x4c11a4);
    iVar3 = QWidget::width((QWidget *)0x4c11b5);
    iVar4 = QRect::x((QRect *)0x4c11ce);
    iVar5 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    if (iVar4 + iVar5 < iVar2 + iVar3) {
      iVar2 = QWidget::width((QWidget *)0x4c11fc);
      iVar2 = iVar2 + 4;
      piVar9 = QPoint::rx((QPoint *)0x4c1210);
      *piVar9 = *piVar9 - iVar2;
    }
    iVar3 = QPoint::y((QPoint *)0x4c1227);
    iVar2 = QWidget::height((QWidget *)0x4c1238);
    iVar3 = iVar3 + iVar2;
    iVar2 = QRect::y((QRect *)0x4c1251);
    iVar4 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    if (iVar2 + iVar4 < iVar3) {
      iVar2 = QWidget::height((QWidget *)0x4c127f);
      iVar2 = iVar2 + 0x18;
      piVar9 = QPoint::ry((QPoint *)0x4c1293);
      *piVar9 = *piVar9 - iVar2;
    }
    iVar2 = QPoint::y((QPoint *)0x4c12aa);
    iVar3 = QRect::y((QRect *)0x4c12bb);
    if (iVar2 < iVar3) {
      QRect::y((QRect *)0x4c12d2);
      QPoint::setY((QPoint *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                   in_stack_fffffffffffffe9c);
    }
    in_stack_fffffffffffffecc = QPoint::x((QPoint *)0x4c12ee);
    in_stack_fffffffffffffed4 = QWidget::width((QWidget *)0x4c12ff);
    in_stack_fffffffffffffed4 = in_stack_fffffffffffffecc + in_stack_fffffffffffffed4;
    in_stack_fffffffffffffed0 = QRect::x((QRect *)0x4c1318);
    iVar2 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    if (in_stack_fffffffffffffed0 + iVar2 < in_stack_fffffffffffffed4) {
      in_stack_fffffffffffffec8 = QRect::x((QRect *)0x4c1346);
      iVar2 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      in_stack_fffffffffffffec8 = in_stack_fffffffffffffec8 + iVar2;
      QWidget::width((QWidget *)0x4c1370);
      QPoint::setX((QPoint *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                   in_stack_fffffffffffffe9c);
    }
    iVar2 = QPoint::x((QPoint *)0x4c1390);
    iVar3 = QRect::x((QRect *)0x4c13a1);
    if (iVar2 < iVar3) {
      QRect::x((QRect *)0x4c13b8);
      QPoint::setX((QPoint *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                   in_stack_fffffffffffffe9c);
    }
    iVar3 = QPoint::y((QPoint *)0x4c13d4);
    iVar2 = QWidget::height((QWidget *)0x4c13e5);
    iVar3 = iVar3 + iVar2;
    iVar2 = QRect::y((QRect *)0x4c13fe);
    iVar4 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    if (iVar2 + iVar4 < iVar3) {
      QRect::y((QRect *)0x4c142c);
      QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      QWidget::height((QWidget *)0x4c1456);
      QPoint::setY((QPoint *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                   in_stack_fffffffffffffe9c);
    }
  }
  QWidget::move((QWidget *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                (QPoint *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTipLabel::placeTip(const QPoint &pos, QWidget *w)
{
#ifndef QT_NO_STYLE_STYLESHEET
    if (testAttribute(Qt::WA_StyleSheet) || (w && qt_styleSheet(w->style()))) {
        //the stylesheet need to know the real parent
        QTipLabel::instance->setProperty("_q_stylesheet_parent", QVariant::fromValue(w));
        //we force the style to be the QStyleSheetStyle, and force to clear the cache as well.
        QTipLabel::instance->setStyleSheet("/* */"_L1);

        // Set up for cleaning up this later...
        QTipLabel::instance->styleSheetParent = w;
        if (w) {
            connect(w, &QWidget::destroyed,
                    QTipLabel::instance, &QTipLabel::styleSheetParentDestroyed);
        }
        // QTBUG-64550: A font inherited by the style sheet might change the size,
        // particular on Windows, where the tip is not parented on a window.
        // The updatesSize() also makes sure that the content size be updated with
        // correct content margin.
        QTipLabel::instance->updateSize(pos);
    }
#endif //QT_NO_STYLE_STYLESHEET

    QPoint p = pos;
    const QScreen *screen = getTipScreen(pos, w);
    // a QScreen's handle *should* never be null, so this is a bit paranoid
    if (const QPlatformScreen *platformScreen = screen ? screen->handle() : nullptr) {
        QPlatformCursor *cursor = platformScreen->cursor();
        // default implementation of QPlatformCursor::size() returns QSize(16, 16)
        const QSize nativeSize = cursor ? cursor->size() : QSize(16, 16);
        const QSize cursorSize = QHighDpi::fromNativePixels(nativeSize,
                                                            platformScreen);
        QPoint offset(2, cursorSize.height());
        // assuming an arrow shape, we can just move to the side for very large cursors
        if (cursorSize.height() > 2 * this->height())
            offset = QPoint(cursorSize.width() / 2, 0);

        p += offset;

        QRect screenRect = screen->geometry();
        if (p.x() + this->width() > screenRect.x() + screenRect.width())
        p.rx() -= 4 + this->width();
        if (p.y() + this->height() > screenRect.y() + screenRect.height())
        p.ry() -= 24 + this->height();
        if (p.y() < screenRect.y())
            p.setY(screenRect.y());
        if (p.x() + this->width() > screenRect.x() + screenRect.width())
            p.setX(screenRect.x() + screenRect.width() - this->width());
        if (p.x() < screenRect.x())
            p.setX(screenRect.x());
        if (p.y() + this->height() > screenRect.y() + screenRect.height())
            p.setY(screenRect.y() + screenRect.height() - this->height());
    }
    this->move(p);
}